

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Double(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         *this,double d)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  char *buffer;
  
  Prefix(this,kNumberType);
  this_00 = &this->os_->stack_;
  buffer = this_00->stackTop_;
  if ((long)this_00->stackEnd_ - (long)buffer < 0x19) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,0x19);
    buffer = this_00->stackTop_;
  }
  this_00->stackTop_ = buffer + 0x19;
  pcVar1 = internal::dtoa(d,buffer,this->maxDecimalPlaces_);
  (this->os_->stack_).stackTop_ =
       pcVar1 + (long)((this->os_->stack_).stackTop_ + (-0x19 - (long)buffer));
  return true;
}

Assistant:

bool Double(double d)       { Prefix(kNumberType); return EndValue(WriteDouble(d)); }